

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindow.cpp
# Opt level: O2

void __thiscall
QMainWindow::addDockWidget
          (QMainWindow *this,DockWidgetArea area,QDockWidget *dockwidget,Orientation orientation)

{
  bool bVar1;
  
  bVar1 = checkDockWidgetArea(area,"QMainWindow::addDockWidget");
  if (bVar1) {
    QMainWindowLayout::addDockWidget
              (*(QMainWindowLayout **)(*(long *)&(this->super_QWidget).field_0x8 + 0x260),area,
               dockwidget,orientation);
    return;
  }
  return;
}

Assistant:

void QMainWindow::addDockWidget(Qt::DockWidgetArea area, QDockWidget *dockwidget,
                                Qt::Orientation orientation)
{
    if (!checkDockWidgetArea(area, "QMainWindow::addDockWidget"))
        return;

    // add a window to an area, placing done relative to the previous
    d_func()->layout->addDockWidget(area, dockwidget, orientation);
}